

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# inlined_vector.h
# Opt level: O3

void __thiscall
absl::lts_20240722::inlined_vector_internal::
Storage<absl::lts_20240722::str_format_internal::FormatArgImpl,4ul,std::allocator<absl::lts_20240722::str_format_internal::FormatArgImpl>>
::
Initialize<absl::lts_20240722::inlined_vector_internal::IteratorValueAdapter<std::allocator<absl::lts_20240722::str_format_internal::FormatArgImpl>,absl::lts_20240722::str_format_internal::FormatArgImpl_const*>>
          (Storage<absl::lts_20240722::str_format_internal::FormatArgImpl,4ul,std::allocator<absl::lts_20240722::str_format_internal::FormatArgImpl>>
           *this,IteratorValueAdapter<std::allocator<absl::lts_20240722::str_format_internal::FormatArgImpl>,_const_absl::lts_20240722::str_format_internal::FormatArgImpl_*>
                 values,
          SizeType<std::allocator<absl::lts_20240722::str_format_internal::FormatArgImpl>_> new_size
          )

{
  undefined8 *puVar1;
  undefined8 *puVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  Data DVar5;
  undefined8 uVar6;
  FormatArgImpl *pFVar7;
  long lVar8;
  SizeType<std::allocator<absl::lts_20240722::str_format_internal::FormatArgImpl>_> SVar9;
  ulong extraout_RDX;
  size_type __n;
  
  if ((*(ulong *)this & 1) != 0) {
    Initialize<absl::lts_20240722::inlined_vector_internal::IteratorValueAdapter<std::allocator<absl::lts_20240722::str_format_internal::FormatArgImpl>,absl::lts_20240722::str_format_internal::FormatArgImpl_const*>>
              ();
LAB_00110ce5:
    Initialize<absl::lts_20240722::inlined_vector_internal::IteratorValueAdapter<std::allocator<absl::lts_20240722::str_format_internal::FormatArgImpl>,absl::lts_20240722::str_format_internal::FormatArgImpl_const*>>
              ();
    if ((ulong)values.it_ >> 0x3b == 0) {
      operator_new((long)values.it_ << 4);
      return;
    }
    pFVar7 = values.it_;
    __gnu_cxx::new_allocator<absl::lts_20240722::str_format_internal::FormatArgImpl>::allocate
              ((new_allocator<absl::lts_20240722::str_format_internal::FormatArgImpl> *)values.it_);
    if (0xf < extraout_RDX) {
      cord_internal::InlineData::set_inline_data();
      if ((((pFVar7->data_).buf[0] & 1U) != 0) && ((((values.it_)->data_).buf[0] & 1U) != 0)) {
        return;
      }
      __assert_fail("data1.is_tree() && data2.is_tree()",
                    "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O3/_deps/absl-src/absl/strings/internal/cord_internal.h"
                    ,0x237,
                    "static bool absl::cord_internal::InlineData::is_either_profiled(const InlineData &, const InlineData &)"
                   );
    }
    (pFVar7->data_).buf[0] = (char)extraout_RDX * '\x02';
    if (7 < extraout_RDX) {
      DVar5 = (values.it_)->data_;
      uVar6 = *(undefined8 *)((long)values.it_ + (extraout_RDX - 8));
      pFVar7->dispatcher_ = (Dispatcher)0x0;
      *(Data *)((long)&pFVar7->data_ + 1) = DVar5;
      *(undefined8 *)((long)pFVar7 + (extraout_RDX - 7)) = uVar6;
      return;
    }
    if (3 < extraout_RDX) {
      uVar3 = *(undefined4 *)&(values.it_)->data_;
      uVar4 = *(undefined4 *)((long)values.it_ + (extraout_RDX - 4));
      *(undefined4 *)((long)&pFVar7->data_ + 5) = 0;
      pFVar7->dispatcher_ = (Dispatcher)0x0;
      *(undefined4 *)((long)&pFVar7->data_ + 1) = uVar3;
      *(undefined4 *)((long)pFVar7 + (extraout_RDX - 3)) = uVar4;
      return;
    }
    if (extraout_RDX != 0) {
      (pFVar7->data_).buf[1] = ((values.it_)->data_).buf[0];
      (pFVar7->data_).buf[(extraout_RDX >> 1) + 1] = ((values.it_)->data_).buf[extraout_RDX >> 1];
      (pFVar7->data_).buf[extraout_RDX] = *(char *)((long)values.it_ + (extraout_RDX - 1));
    }
    pFVar7->dispatcher_ = (Dispatcher)0x0;
    *(undefined8 *)((long)&pFVar7->data_ + extraout_RDX + 1) = 0;
    return;
  }
  if (*(ulong *)this != 0) goto LAB_00110ce5;
  if (new_size < 5) {
    if (new_size == 0) {
      lVar8 = 0;
      goto LAB_00110cc9;
    }
    pFVar7 = (FormatArgImpl *)(this + 8);
  }
  else {
    __n = 8;
    if (8 < new_size) {
      __n = new_size;
    }
    pFVar7 = __gnu_cxx::new_allocator<absl::lts_20240722::str_format_internal::FormatArgImpl>::
             allocate((new_allocator<absl::lts_20240722::str_format_internal::FormatArgImpl> *)this,
                      __n,(void *)0x0);
    *(FormatArgImpl **)(this + 8) = pFVar7;
    *(size_type *)(this + 0x10) = __n;
    *this = (Storage<absl::lts_20240722::str_format_internal::FormatArgImpl,4ul,std::allocator<absl::lts_20240722::str_format_internal::FormatArgImpl>>
             )((byte)*this | 1);
  }
  lVar8 = 0;
  SVar9 = new_size;
  do {
    puVar1 = (undefined8 *)((long)&(values.it_)->data_ + lVar8);
    uVar6 = puVar1[1];
    puVar2 = (undefined8 *)((long)&pFVar7->data_ + lVar8);
    *puVar2 = *puVar1;
    puVar2[1] = uVar6;
    lVar8 = lVar8 + 0x10;
    SVar9 = SVar9 - 1;
  } while (SVar9 != 0);
  lVar8 = *(long *)this;
LAB_00110cc9:
  *(SizeType<std::allocator<absl::lts_20240722::str_format_internal::FormatArgImpl>_> *)this =
       lVar8 + new_size * 2;
  return;
}

Assistant:

bool GetIsAllocated() const { return GetSizeAndIsAllocated() & 1; }